

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O0

void USPE(double *inp,int N,int p,int q,double *phi,double *theta,double *thetac,double *var)

{
  int M;
  double *acov;
  double *A_00;
  double *b_00;
  int *ipiv_00;
  double *__ptr;
  undefined8 *__ptr_00;
  double *array;
  double *__ptr_01;
  double *x_00;
  double *A_01;
  int *ipiv_01;
  double dVar1;
  double dVar2;
  int *ipiv2;
  int *ipiv;
  double *h;
  double *T;
  double *tau;
  double *f;
  double *x;
  double *c2;
  double *A;
  double *c;
  double *b;
  double epsilon;
  double tempd;
  double wmean;
  int local_48;
  int it1;
  int temp;
  int t;
  int l;
  int j;
  int i;
  int K;
  double *theta_local;
  double *phi_local;
  int q_local;
  int p_local;
  int N_local;
  double *inp_local;
  
  M = p + q + 1;
  acov = (double *)malloc((long)M << 3);
  A_00 = (double *)malloc((long)p * 8 * (long)p);
  b_00 = (double *)malloc((long)p << 3);
  ipiv_00 = (int *)malloc((long)p << 2);
  __ptr = (double *)malloc((long)(q + 1) << 3);
  __ptr_00 = (undefined8 *)malloc((long)(p + 1) << 3);
  array = (double *)malloc((long)(q + 1) << 3);
  __ptr_01 = (double *)malloc((long)(q + 1) << 3);
  x_00 = (double *)malloc((long)(q + 1) << 3);
  A_01 = (double *)malloc((long)(q + 1) * 8 * (long)(q + 1));
  ipiv_01 = (int *)malloc((long)(q + 1) << 2);
  autocovar(inp,N,acov,M);
  dVar1 = mean(inp,N);
  *__ptr_00 = 0xbff0000000000000;
  for (l = 0; l < p; l = l + 1) {
    phi[l] = 0.0;
  }
  for (l = 0; l < q; l = l + 1) {
    theta[l] = 0.0;
  }
  if (0 < p) {
    for (l = 1; l <= p; l = l + 1) {
      for (t = 1; t <= p; t = t + 1) {
        local_48 = (q + l) - t;
        if (local_48 < 0) {
          local_48 = -local_48;
        }
        A_00[(l + -1) * p + t + -1] = acov[local_48];
      }
    }
    for (l = 0; l < p; l = l + 1) {
      b_00[l] = acov[q + l + 1];
    }
    ludecomp(A_00,p,ipiv_00);
    linsolve(A_00,p,b_00,ipiv_00,phi);
  }
  for (l = 0; l < p; l = l + 1) {
    __ptr_00[l + 1] = phi[l];
  }
  if (p == 0) {
    for (l = 0; l < q + 1; l = l + 1) {
      __ptr[l] = acov[l];
    }
  }
  else {
    for (t = 0; t < q + 1; t = t + 1) {
      epsilon = 0.0;
      for (l = 0; l < p + 1; l = l + 1) {
        for (temp = 0; temp < p + 1; temp = temp + 1) {
          local_48 = (t + l) - temp;
          if (local_48 < 0) {
            local_48 = -local_48;
          }
          epsilon = (double)__ptr_00[l] * (double)__ptr_00[temp] * acov[local_48] + epsilon;
        }
      }
      __ptr[t] = epsilon;
    }
  }
  for (l = 0; l <= q; l = l + 1) {
    __ptr_01[l] = 0.0;
    array[l] = 0.0;
  }
  dVar2 = sqrt(*__ptr);
  *__ptr_01 = dVar2;
  for (t = 0; t <= q; t = t + 1) {
    for (l = 0; l < (q - t) + 1; l = l + 1) {
      array[t] = __ptr_01[l] * __ptr_01[l + t] + array[t];
    }
    array[t] = array[t] - __ptr[t];
  }
  wmean._4_4_ = 0;
  while (dVar2 = array_max_abs(array,q + 1), 0.0001 < dVar2 && wmean._4_4_ < 200) {
    wmean._4_4_ = wmean._4_4_ + 1;
    for (l = 0; l < q + 1; l = l + 1) {
      for (t = 0; t < q + 1; t = t + 1) {
        epsilon = 0.0;
        if (l + t <= q) {
          epsilon = __ptr_01[l + t] + 0.0;
        }
        if (-1 < t - l) {
          epsilon = epsilon + __ptr_01[t - l];
        }
        A_01[l * (q + 1) + t] = epsilon;
      }
    }
    ludecomp(A_01,q + 1,ipiv_01);
    linsolve(A_01,q + 1,array,ipiv_01,x_00);
    for (l = 0; l < q + 1; l = l + 1) {
      __ptr_01[l] = __ptr_01[l] - x_00[l];
      array[l] = 0.0;
    }
    for (t = 0; t < q + 1; t = t + 1) {
      for (l = 0; l < (q - t) + 1; l = l + 1) {
        array[t] = __ptr_01[l] * __ptr_01[l + t] + array[t];
      }
      array[t] = array[t] - __ptr[t];
    }
  }
  *thetac = 0.0;
  if (p < 1) {
    *thetac = dVar1;
  }
  else {
    epsilon = 0.0;
    for (l = 0; l < p; l = l + 1) {
      epsilon = (double)__ptr_00[l + 1] + epsilon;
    }
    *thetac = dVar1 * (1.0 - epsilon);
  }
  for (t = 1; t < q + 1; t = t + 1) {
    theta[t + -1] = (__ptr_01[t] * -1.0) / *__ptr_01;
  }
  *var = *__ptr_01 * *__ptr_01;
  if (q == 0) {
    epsilon = 0.0;
    for (l = 0; l < p; l = l + 1) {
      epsilon = acov[l + 1] * (double)__ptr_00[l + 1] + epsilon;
    }
    *var = *acov - epsilon;
  }
  free(acov);
  free(A_00);
  free(b_00);
  free(ipiv_00);
  free(__ptr);
  free(__ptr_00);
  free(array);
  free(__ptr_01);
  free(A_01);
  free(ipiv_01);
  free(x_00);
  return;
}

Assistant:

void USPE(double *inp,int N,int p, int q, double *phi,double *theta,double *thetac,double *var) {
	int K,i,j,l,t,temp,it1;
	double wmean,tempd,epsilon;
	double *b,*c,*A,*c2,*x,*f,*tau,*T,*h;
	int *ipiv,*ipiv2;

	K = p + q + 1;

	c = (double *) malloc(sizeof(double) * K);
	A = (double *) malloc(sizeof(double) * p * p);
	b = (double *) malloc(sizeof(double) * p);
	ipiv = (int *) malloc(sizeof(int) * p);
	c2 = (double *) malloc(sizeof(double) * (q+1));
	x = (double *) malloc(sizeof(double) * (p+1));
	f = (double *) malloc(sizeof(double) * (q+1));
	tau = (double *) malloc(sizeof(double) * (q+1));
	h = (double *) malloc(sizeof(double) * (q+1));
	T = (double *) malloc(sizeof(double) * (q+1) * (q+1));
	ipiv2 = (int *) malloc(sizeof(int) * (q+1));


	autocovar(inp,N,c,K);
	wmean = mean(inp,N);
	x[0] = -1.0;

	for(i = 0; i < p;++i) {
		phi[i] = 0.0;
	}

	for(i = 0; i < q;++i) {
		theta[i] = 0.0;
	}

	//Step 1
	if (p > 0) {

		for(i = 1; i <= p;++i) {
			t = (i-1) * p;
			for(j = 1; j <= p;++j) {
				temp = q+i-j;
				if (temp < 0) {
					temp = -temp;
				}
				A[t+j-1] = c[temp];
			}
		}

		for(i = 0; i < p;++i) {
			b[i] = c[q+i+1];
		}

		ludecomp(A,p,ipiv);
		linsolve(A,p,b,ipiv,phi);

	}


	for(i = 0; i < p;++i) {
		x[i+1] = phi[i];
	}

	// Step 2
	if (p == 0) {
		for(i = 0; i < q + 1; ++i) {
			c2[i] = c[i];
		}
	} else {
		for(j = 0; j < q + 1;++j) {
			tempd = 0.0;
			for(i = 0; i < p + 1;++i) {
				for(l = 0; l < p + 1; ++l) {
					temp = j + i - l;
					if (temp < 0) {
						temp = -temp;
					}
					tempd += x[i]*x[l]*c[temp];
				}
			}
			c2[j] = tempd;
		}

	}

	//Step 3 Newton Raphson Method

	epsilon = 0.0001;

	for(i = 0; i <= q;++i) {
		tau[i] = 0.0;
		f[i] = 0.0;
	}
	tau[0] = sqrt(c2[0]);

	for(j = 0; j <= q;++j) {
		for(i = 0; i < q-j+1;++i) {
			f[j] += tau[i] * tau[i+j];
		}
		f[j] -= c2[j];
	}

	it1 = 0;

	while (array_max_abs(f,q+1) > epsilon && it1 < 200) {
		it1++;
		for(i = 0; i < q+1;++i) {
			t = i * (q+1);
			for(j = 0; j < q+1;++j) {
				tempd = 0.0;
				if (i + j <= q) {
					tempd=tempd+tau[i+j];
				}
				if (j - i >= 0 ) {
					tempd=tempd+tau[j-i];
				}
				T[t+j] = tempd;
			}
		}
		//mdisplay(T,q+1,q+1);
		ludecomp(T,q+1,ipiv2);
		linsolve(T,q+1,f,ipiv2,h);

		for(i = 0; i < q+1;++i) {
			tau[i] = tau[i] - h[i];
			f[i] = 0.0;
		}

		for(j = 0; j < q+1;++j) {
			for(i = 0; i < q-j+1;++i) {
				f[j]=f[j]+tau[i]*tau[i+j];
			}
			f[j] = f[j] - c2[j];
		}
	}

	*thetac = 0.0;

	if (p > 0) {
		tempd = 0.0;
		for(i = 0; i < p;++i) {
			tempd += x[i+1];
		}
		*thetac = wmean * (1.0 - tempd);
	} else {
		*thetac = wmean;
	}

	for(j = 1; j < q+1;++j) {
		theta[j-1]=-1.0*tau[j]/tau[0];
	}

	*var = tau[0] * tau[0];

	if (q == 0) {
		tempd = 0.0;
		for(i = 0; i < p;++i) {
			tempd = tempd + c[i+1] * x[i+1];
		}
		*var = c[0] - tempd;
	}

	free(c);
	free(A);
	free(b);
	free(ipiv);
	free(c2);
	free(x);
	free(f);
	free(tau);
	free(T);
	free(ipiv2);
	free(h);
}